

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Downloader_libcurl::download
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL,string *path,
          bool neededWriteBack)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  int *piVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  char local_2e0 [8];
  ofstream fout;
  int local_e0;
  int i;
  CURLcode err;
  memBlockStruc *buf;
  string local_b0 [8];
  string output;
  int local_90;
  int retryCount;
  bool needTry;
  CURL *curl;
  undefined1 local_50 [8];
  string fileName;
  bool neededWriteBack_local;
  string *path_local;
  string *downloadURL_local;
  Downloader_libcurl *this_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ret;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__);
  getFileNameFromURL((Downloader_libcurl *)local_50,(string *)this);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
  std::__cxx11::string::string((string *)&curl);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,(string *)&curl);
  std::__cxx11::string::~string((string *)&curl);
  uVar5 = curl_easy_init();
  uVar6 = std::__cxx11::string::c_str();
  curl_easy_setopt(uVar5,0x2712,uVar6);
  curl_easy_setopt(uVar5,0x4e2b,fetchDownloadedData);
  curl_easy_setopt(uVar5,0x14,10);
  curl_easy_setopt(uVar5,0x13,0x400);
  bVar1 = true;
  local_90 = 0;
  std::__cxx11::string::string(local_b0);
  while (bVar1) {
    local_90 = local_90 + 1;
    if (local_90 < 9) {
      std::__cxx11::string::operator+=(local_b0,"Downloading ");
      std::__cxx11::string::operator+=(local_b0,(string *)local_50);
      std::__cxx11::string::operator+=(local_b0,", retry counter: ");
      std::__cxx11::to_string((__cxx11 *)&buf,local_90);
      std::__cxx11::string::operator+=(local_b0,(string *)&buf);
      std::__cxx11::string::~string((string *)&buf);
      std::__cxx11::string::operator+=(local_b0,"\n");
      std::operator<<((ostream *)&std::cout,local_b0);
      std::__cxx11::string::clear();
      piVar7 = (int *)operator_new(0x10);
      *piVar7 = 0;
      piVar7[1] = 1;
      piVar7[2] = 0;
      piVar7[3] = 0;
      curl_easy_setopt(uVar5,0x2711,piVar7);
      iVar3 = curl_easy_perform(uVar5);
      if (iVar3 == 0) {
        std::__cxx11::string::operator+=(local_b0,"Downloaded ");
        std::__cxx11::string::operator+=(local_b0,(string *)local_50);
        std::__cxx11::string::operator+=(local_b0,"\n");
        std::operator<<((ostream *)&std::cout,local_b0);
        std::__cxx11::string::clear();
        for (local_e0 = 0; local_e0 < *piVar7; local_e0 = local_e0 + 1) {
          std::__cxx11::string::operator+=
                    ((string *)&__return_storage_ptr__->second,
                     *(char *)(*(long *)(piVar7 + 2) + (long)local_e0));
        }
        bVar1 = false;
        if (neededWriteBack) {
          std::operator+(local_300,path);
          _Var4 = std::operator|(_S_out,_S_bin);
          std::ofstream::ofstream(local_2e0,(string *)local_300,_Var4);
          std::__cxx11::string::~string((string *)local_300);
          bVar2 = std::ofstream::is_open();
          if ((bVar2 & 1) != 0) {
            lVar8 = std::__cxx11::string::c_str();
            std::__cxx11::string::length();
            std::ostream::write(local_2e0,lVar8);
          }
          std::ofstream::close();
          std::ofstream::~ofstream(local_2e0);
        }
      }
      if (piVar7 != (int *)0x0) {
        operator_delete(piVar7,0x10);
      }
    }
    else {
      std::__cxx11::string::operator+=(local_b0,"Retry limit exceeded: ");
      std::__cxx11::string::operator+=(local_b0,(string *)local_50);
      std::__cxx11::string::operator+=(local_b0,", download failed\n");
      std::operator<<((ostream *)&std::cout,local_b0);
      std::__cxx11::string::clear();
      bVar1 = false;
    }
  }
  curl_easy_cleanup(uVar5);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> Downloader_libcurl::download(const std::string &downloadURL, const std::string &path, bool neededWriteBack)
{
    auto ret = std::pair<std::string, std::string>();

    auto fileName = this->getFileNameFromURL(downloadURL);

    ret.first = fileName;
    ret.second = std::string();

    //curl environment setup
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, downloadURL.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, this->fetchDownloadedData);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, lowSpeedTimeout);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, lowSpeedBound);

    bool needTry = true;

    int retryCount = 0;
    auto output = std::string();

    while(needTry)
    {
        retryCount++;

        if(retryCount > retryLimit)
        {
            output += "Retry limit exceeded: ";
            output += fileName;
            output += ", download failed\n";
            std::cout << output;
            output.clear();
            needTry = false;
            continue;
        }

        output += "Downloading ";
        output += fileName;
        output += ", retry counter: ";
        output += std::to_string(retryCount);
        output += "\n";
        std::cout << output;
        output.clear();

        //temporary storage allocation
        auto *buf = new memBlockStruc {0, 1, nullptr};

        //download part
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)buf);
        auto err = curl_easy_perform(curl);

        //needTry comes false when download completed or retry limit exceeded
        if(err == CURLE_OK)
        {
            output += "Downloaded ";
            output += fileName;
            output += "\n";
            std::cout << output;
            output.clear();

            for(int i = 0; i < buf->realSize; i++) ret.second += buf->memBlock[i];
            needTry = false;

            if(neededWriteBack)
            {
                std::ofstream fout(path + ret.first, std::ios::out | std::ios::binary);
                if (fout.is_open()) fout.write(ret.second.c_str(), ret.second.length());
                fout.close();
            }
        }

        //temporary storage release
        delete buf;
    }

    //curl exit
    curl_easy_cleanup(curl);

    //return
    return ret;
}